

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)

{
  uint8_t *puVar1;
  FACTWave *pFVar2;
  FACTSoundBank *pFVar3;
  FACTTrackInstance *pFVar4;
  FACTCue *pFVar5;
  FACTAudioEngine *pFVar6;
  long lVar7;
  ulong uVar8;
  FACTNotification local_49;
  
  pFVar5 = sound->parentCue;
  pFVar5->playingSound = (FACTSoundInstance *)0x0;
  if (sound->sound->trackCount != '\0') {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pFVar4 = sound->tracks;
      pFVar2 = *(FACTWave **)((long)&(pFVar4->activeWave).wave + lVar7);
      if (pFVar2 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar2);
        pFVar4 = sound->tracks;
      }
      pFVar2 = *(FACTWave **)((long)&(pFVar4->upcomingWave).wave + lVar7);
      if (pFVar2 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar2);
        pFVar4 = sound->tracks;
      }
      (*sound->parentCue->parentBank->parentEngine->pFree)
                (*(void **)((long)&pFVar4->events + lVar7));
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x68;
    } while (uVar8 < sound->sound->trackCount);
    pFVar5 = sound->parentCue;
  }
  (*pFVar5->parentBank->parentEngine->pFree)(sound->tracks);
  pFVar5 = sound->parentCue;
  uVar8 = (ulong)sound->sound->category;
  pFVar3 = pFVar5->parentBank;
  pFVar6 = pFVar3->parentEngine;
  if (uVar8 != 0xffff) {
    puVar1 = &pFVar6->categories[uVar8].instanceCount;
    *puVar1 = *puVar1 + 0xff;
  }
  pFVar5->state = pFVar5->state & 0xffffffc7 | 0x20;
  puVar1 = &pFVar5->data->instanceCount;
  *puVar1 = *puVar1 + 0xff;
  if ((pFVar6->notifications & NOTIFY_CUESTOP) != 0) {
    local_49.type = '\x03';
    local_49.pvContext = pFVar6->cue_context;
    local_49.field_3.cue.cueIndex = pFVar5->index;
    local_49.field_3.cue.pSoundBank = pFVar3;
    local_49.field_3.cue.pCue = pFVar5;
    (*pFVar6->notificationCallback)(&local_49);
    pFVar6 = sound->parentCue->parentBank->parentEngine;
  }
  (*pFVar6->pFree)(sound);
  return;
}

Assistant:

void FACT_INTERNAL_DestroySound(FACTSoundInstance *sound)
{
	uint8_t i;

	sound->parentCue->playingSound = NULL;
	for (i = 0; i < sound->sound->trackCount; i += 1)
	{
		if (sound->tracks[i].activeWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].activeWave.wave
			);
		}
		if (sound->tracks[i].upcomingWave.wave != NULL)
		{
			FACTWave_Destroy(
				sound->tracks[i].upcomingWave.wave
			);
		}
		sound->parentCue->parentBank->parentEngine->pFree(
			sound->tracks[i].events
		);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound->tracks);

	if (sound->sound->category != FACTCATEGORY_INVALID)
	{
		sound->parentCue->parentBank->parentEngine->categories[
			sound->sound->category
		].instanceCount -= 1;
	}

	/* TODO: if (sound->parentCue->playingSounds == NULL) */
	{
		sound->parentCue->state |= FACT_STATE_STOPPED;
		sound->parentCue->state &= ~(FACT_STATE_PLAYING | FACT_STATE_STOPPING);
		sound->parentCue->data->instanceCount -= 1;

		FACT_INTERNAL_SendCueNotification(sound->parentCue, NOTIFY_CUESTOP, FACTNOTIFICATIONTYPE_CUESTOP);
	}
	sound->parentCue->parentBank->parentEngine->pFree(sound);
}